

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
embree::ImageT<embree::Col3<unsigned_char>_>::ImageT
          (ImageT<embree::Col3<unsigned_char>_> *this,size_t width,size_t height,
          Col3<unsigned_char> *color,bool copy,string *name,bool flip_y)

{
  undefined1 auVar1 [16];
  Col3<unsigned_char> *pCVar2;
  long lVar3;
  uchar *puVar4;
  size_t sVar5;
  ulong uVar6;
  undefined7 in_register_00000081;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  
  Image::Image(&this->super_Image,width,height,name);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002aa1e8;
  if ((int)CONCAT71(in_register_00000081,copy) == 0) {
    this->data = color;
  }
  else {
    uVar8 = height * width;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(3),8) == 0) {
      uVar6 = SUB168(auVar1 * ZEXT816(3),0);
    }
    pCVar2 = (Col3<unsigned_char> *)operator_new__(uVar6);
    this->data = pCVar2;
    if (flip_y) {
      puVar4 = &color->r + (height - 1) * width * 3;
      for (sVar5 = 0; lVar3 = 2, sVar7 = width, sVar5 != height; sVar5 = sVar5 + 1) {
        while (sVar7 != 0) {
          *(uchar *)((long)pCVar2 + lVar3 + -2) = puVar4[lVar3 + -2];
          *(uchar *)((long)pCVar2 + lVar3 + -1) = puVar4[lVar3 + -1];
          (&pCVar2->r)[lVar3] = puVar4[lVar3];
          lVar3 = lVar3 + 3;
          sVar7 = sVar7 - 1;
        }
        puVar4 = puVar4 + width * -3;
        pCVar2 = pCVar2 + width;
      }
    }
    else {
      lVar3 = 2;
      while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
        pCVar2 = this->data;
        *(undefined1 *)((long)pCVar2 + lVar3 + -2) = *(undefined1 *)((long)color + lVar3 + -2);
        *(undefined1 *)((long)pCVar2 + lVar3 + -1) = *(undefined1 *)((long)color + lVar3 + -1);
        (&pCVar2->r)[lVar3] = (&color->r)[lVar3];
        lVar3 = lVar3 + 3;
      }
    }
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, T* color, const bool copy = true, const std::string& name = "", const bool flip_y = false)
      : Image(width,height,name)
    {
      if (copy)
      {
        data = new T[width*height];

        if (flip_y)
        {
          const T* in = color + (height-1) * width;
          T* out = data;

          for (size_t y=0; y<height; y++)
          {
            for (size_t x=0; x<width; x++)
              out[x] = in[x];

            in -= width;
            out += width;
          }
        }
        else
        {
          for (size_t i=0; i<width*height; i++)
            data[i] = color[i];
        }
      } 
      else
      {
        data = color;
      }
    }